

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O1

void __thiscall
cplus::utils::Set<cplus::lang::String>::TreeNode::forEach
          (TreeNode *this,function<void_(cplus::utils::Set<cplus::lang::String>::TreeNode_*)> *func)

{
  bool bVar1;
  TreeNode *state;
  ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*> taskQueue;
  TreeNode *local_78;
  TreeNode *local_70;
  ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*> local_68;
  
  local_78 = this;
  ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*>::ArrayStack(&local_68,0x80,800);
  if (local_78 != (TreeNode *)0x0) {
    do {
      local_70 = local_78;
      if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*func->_M_invoker)((_Any_data *)func,&local_70);
      if (local_78->left != (TreeNode *)0x0) {
        local_70 = local_78->left;
        ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*>::push(&local_68,&local_70);
      }
      if (local_78->right != (TreeNode *)0x0) {
        local_70 = local_78->right;
        ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*>::push(&local_68,&local_70);
      }
      bVar1 = ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*>::pop
                        (&local_68,&local_78);
    } while (bVar1 && local_78 != (TreeNode *)0x0);
  }
  ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*>::~ArrayStack(&local_68);
  return;
}

Assistant:

void forEach(std::function<void(TreeNode *)> func) {
					TreeNode *state = this;
					ArrayStack<TreeNode *> taskQueue;
					while (state != nullptr) {
						func(state);
						if (state->getLeft() != nullptr)taskQueue.push(state->getLeft());
						if (state->getRight() != nullptr)taskQueue.push(state->getRight());
						if (!taskQueue.pop(state))break;
					}
				}